

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safety_supported.c
# Opt level: O0

config_mutex_t * thread_safety_new_mutex(void)

{
  config_mutex_t *mutex;
  
  if ((mutex_cache == (cache *)0x0) &&
     (mutex_cache = cache_new(0x28,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0),
     mutex_cache == (cache *)0x0)) {
    mutex = (config_mutex_t *)0x0;
  }
  else {
    mutex = (config_mutex_t *)cache_alloc(mutex_cache);
    if (mutex == (pthread_mutex_t *)0x0) {
      mutex = (config_mutex_t *)0x0;
    }
    else {
      pthread_init_mutex(mutex);
    }
  }
  return mutex;
}

Assistant:

config_mutex_t *
thread_safety_new_mutex( void ) {
  config_mutex_t *mutex;

  if( !mutex_cache ) {
    mutex_cache = cache_new( CONFIG_MUTEX_T_SIZE, NULL, NULL );
    if( !mutex_cache ) {
      return NULL;
    }
  }

  mutex = cache_alloc( mutex_cache );
  if( !mutex ) {
    return NULL;
  }

  config_init_mutex( mutex );
  return mutex;
}